

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall moira::Moira::dump16(Moira *this,char *str,u16 *values,int cnt)

{
  int j;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  StrWriter writer;
  StrWriter local_68;
  
  local_68.style = &this->dataStyle;
  local_68.tab.raw = 8;
  local_68.comment[0] = '\0';
  uVar3 = 0;
  uVar2 = (ulong)(uint)cnt;
  local_68.base = str;
  local_68.ptr = str;
  if (cnt < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      for (iVar1 = 0; iVar1 < (this->dataStyle).tab; iVar1 = iVar1 + 1) {
        *local_68.ptr = ' ';
        local_68.ptr = local_68.ptr + 1;
      }
    }
    StrWriter::operator<<(&local_68,(UInt16)values[uVar3]);
    StrWriter::operator<<(&local_68);
  }
  return;
}

Assistant:

void
Moira::dump16(char *str, u16 values[], int cnt) const
{
    StrWriter writer(str, dataStyle);

    for (int i = 0; i < cnt; i++) {

        for (int j = 0; i && j < dataStyle.tab; j++) writer << ' ';
        writer << UInt16{values[i]} << Finish{};
    }
}